

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::ClearAllBreakpoints(cmDebugger_impl *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  cmDebugger_impl *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->breakpointMutex);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::clear(&this->breakpoints);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void ClearAllBreakpoints() override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    breakpoints.clear();
  }